

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * rbuMalloc(sqlite3rbu *p,sqlite3_int64 nByte)

{
  int iVar1;
  void *pvVar2;
  
  if (p->rc == 0) {
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      pvVar2 = sqlite3Malloc(nByte);
    }
    else {
      pvVar2 = (void *)0x0;
    }
    if (pvVar2 != (void *)0x0) {
      pvVar2 = memset(pvVar2,0,nByte);
      return pvVar2;
    }
    p->rc = 7;
  }
  return (void *)0x0;
}

Assistant:

static void *rbuMalloc(sqlite3rbu *p, sqlite3_int64 nByte){
  void *pRet = 0;
  if( p->rc==SQLITE_OK ){
    assert( nByte>0 );
    pRet = sqlite3_malloc64(nByte);
    if( pRet==0 ){
      p->rc = SQLITE_NOMEM;
    }else{
      memset(pRet, 0, nByte);
    }
  }
  return pRet;
}